

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSwitch.c
# Opt level: O2

Vec_Int_t * Sim_NtkComputeSwitching(Abc_Ntk_t *pNtk,int nPatterns)

{
  int iVar1;
  Vec_Ptr_t *p;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  uint *puVar4;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pNode;
  int nWords;
  int iVar5;
  float fVar6;
  int *local_40;
  
  nWords = ((nPatterns >> 5) + 1) - (uint)((nPatterns & 0x1fU) == 0);
  p = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,nWords,0);
  iVar5 = pNtk->vObjs->nSize;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar1 = iVar5;
  }
  pVVar2->nCap = iVar1;
  if (iVar1 == 0) {
    pVVar2->pArray = (int *)0x0;
    pVVar2->nSize = iVar5;
  }
  else {
    local_40 = (int *)malloc((long)iVar1 << 2);
    pVVar2->pArray = local_40;
    pVVar2->nSize = iVar5;
    if (local_40 != (int *)0x0) {
      memset(local_40,0,(long)iVar5 << 2);
      goto LAB_004033a3;
    }
  }
  local_40 = (int *)0x0;
LAB_004033a3:
  for (iVar5 = 0; iVar5 < pNtk->vCis->nSize; iVar5 = iVar5 + 1) {
    pvVar3 = Vec_PtrEntry(pNtk->vCis,iVar5);
    puVar4 = (uint *)Vec_PtrEntry(p,*(int *)((long)pvVar3 + 0x10));
    Sim_UtilSetRandom(puVar4,nWords);
    fVar6 = Sim_ComputeSwitching(puVar4,nWords);
    local_40[*(int *)((long)pvVar3 + 0x10)] = (int)fVar6;
  }
  p_00 = Abc_AigDfs(pNtk,1,0);
  for (iVar5 = 0; iVar5 < p_00->nSize; iVar5 = iVar5 + 1) {
    pNode = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar5);
    puVar4 = (uint *)Vec_PtrEntry(p,pNode->Id);
    Sim_UtilSimulateNodeOne(pNode,p,nWords,0);
    fVar6 = Sim_ComputeSwitching(puVar4,nWords);
    local_40[pNode->Id] = (int)fVar6;
  }
  free(p_00->pArray);
  free(p_00);
  Sim_UtilInfoFree(p);
  return pVVar2;
}

Assistant:

Vec_Int_t * Sim_NtkComputeSwitching( Abc_Ntk_t * pNtk, int nPatterns )
{
    Vec_Int_t * vSwitching;
    float * pSwitching;
    Vec_Ptr_t * vNodes;
    Vec_Ptr_t * vSimInfo;
    Abc_Obj_t * pNode;
    unsigned * pSimInfo;
    int nSimWords, i;

    // allocate space for simulation info of all nodes
    nSimWords = SIM_NUM_WORDS(nPatterns);
    vSimInfo = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), nSimWords, 0 );
    // assign the random simulation to the CIs
    vSwitching = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    pSwitching = (float *)vSwitching->pArray;
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        pSimInfo = (unsigned *)Vec_PtrEntry(vSimInfo, pNode->Id);
        Sim_UtilSetRandom( pSimInfo, nSimWords );
        pSwitching[pNode->Id] = Sim_ComputeSwitching( pSimInfo, nSimWords );
    }
    // simulate the internal nodes
    vNodes  = Abc_AigDfs( pNtk, 1, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pSimInfo = (unsigned *)Vec_PtrEntry(vSimInfo, pNode->Id);
        Sim_UtilSimulateNodeOne( pNode, vSimInfo, nSimWords, 0 );
        pSwitching[pNode->Id] = Sim_ComputeSwitching( pSimInfo, nSimWords );
    }
    Vec_PtrFree( vNodes );
    Sim_UtilInfoFree( vSimInfo );
    return vSwitching;
}